

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp8e_entropy.c
# Opt level: O1

MPP_RET vp8e_calc_coeff_prob
                  (Vp8ePutBitBuf *bitbuf,RK_S32 (*curr) [4] [8] [3] [11],
                  RK_S32 (*prev) [4] [8] [3] [11])

{
  RK_S32 prob;
  int value;
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  RK_S32 (*paaaRVar5) [8] [3] [11];
  RK_S32 (*paRVar6) [11];
  RK_S32 (*paRVar7) [11];
  RK_S32 (*paRVar8) [11];
  RK_S32 (*paRVar9) [11];
  RK_S32 (*paRVar10) [11];
  RK_S32 (*paRVar11) [11];
  
  paaaRVar5 = coeff_update_prob_tbl;
  lVar3 = 0;
  do {
    lVar2 = 0;
    paRVar6 = (RK_S32 (*) [11])paaaRVar5;
    paRVar8 = (RK_S32 (*) [11])prev;
    paRVar10 = (RK_S32 (*) [11])curr;
    do {
      lVar1 = 0;
      paRVar7 = paRVar6;
      paRVar9 = paRVar8;
      paRVar11 = paRVar10;
      do {
        lVar4 = 0;
        do {
          prob = (*(RK_S32 (*) [3] [11])*paRVar7)[0][lVar4];
          value = (*(RK_S32 (*) [8] [3] [11])*paRVar11)[0][0][lVar4];
          if (value == (*(RK_S32 (*) [8] [3] [11])*paRVar9)[0][0][lVar4]) {
            vp8e_put_bool(bitbuf,prob,0);
          }
          else {
            vp8e_put_bool(bitbuf,prob,1);
            vp8e_put_lit(bitbuf,value,8);
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 != 0xb);
        lVar1 = lVar1 + 1;
        paRVar7 = paRVar7 + 1;
        paRVar9 = paRVar9 + 1;
        paRVar11 = paRVar11 + 1;
      } while (lVar1 != 3);
      lVar2 = lVar2 + 1;
      paRVar6 = paRVar6 + 3;
      paRVar8 = paRVar8 + 3;
      paRVar10 = paRVar10 + 3;
    } while (lVar2 != 8);
    lVar3 = lVar3 + 1;
    paaaRVar5 = (RK_S32 (*) [8] [3] [11])((long)paaaRVar5 + 0x420);
    prev = (RK_S32 (*) [4] [8] [3] [11])((long)prev + 0x420);
    curr = (RK_S32 (*) [4] [8] [3] [11])((long)curr + 0x420);
  } while (lVar3 != 4);
  return MPP_OK;
}

Assistant:

MPP_RET vp8e_calc_coeff_prob(Vp8ePutBitBuf *bitbuf, RK_S32 (*curr)[4][8][3][11],
                             RK_S32 (*prev)[4][8][3][11])
{
    RK_S32 i, j, k, l;
    RK_S32 prob, new, old;

    for (i = 0; i < 4; i++) {
        for (j = 0; j < 8; j++) {
            for (k = 0; k < 3; k++) {
                for (l = 0; l < 11; l++) {
                    prob = coeff_update_prob_tbl[i][j][k][l];
                    old = (RK_S32) (*prev)[i][j][k][l];
                    new = (RK_S32) (*curr)[i][j][k][l];

                    if (new == old) {
                        vp8e_put_bool(bitbuf, prob, 0);
                    } else {
                        vp8e_put_bool(bitbuf, prob, 1);
                        vp8e_put_lit(bitbuf, new, 8);
                    }
                }
            }
        }
    }
    return MPP_OK;
}